

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void PDHG_PrintPDHGParam(CUPDLPwork *w)

{
  CUPDLPsettings *pCVar1;
  CUPDLPresobj *pCVar2;
  CUPDLPstepsize *pCVar3;
  CUPDLPscaling *pCVar4;
  
  pCVar1 = w->settings;
  if (pCVar1->nLogLevel < 2) {
    return;
  }
  pCVar2 = w->resobj;
  pCVar3 = w->stepsize;
  pCVar4 = w->scaling;
  putchar(10);
  putchar(10);
  puts("--------------------------------------------------");
  puts("CUPDHG Parameters:");
  puts("--------------------------------------------------");
  putchar(10);
  printf("    nIterLim:          %d\n",(ulong)(uint)pCVar1->nIterLim);
  printf("    dTimeLim (sec):    %.2f\n",pCVar1->dTimeLim);
  printf("    ifScaling:         %d\n",(ulong)(uint)pCVar1->ifScaling);
  printf("    ifRuizScaling:     %d\n",(ulong)(uint)pCVar4->ifRuizScaling);
  printf("    ifL2Scaling:       %d\n",(ulong)(uint)pCVar4->ifL2Scaling);
  printf("    ifPcScaling:       %d\n",(ulong)(uint)pCVar4->ifPcScaling);
  printf("    eLineSearchMethod: %d\n",(ulong)pCVar3->eLineSearchMethod);
  printf("    dPrimalTol:        %.4e\n",pCVar1->dPrimalTol);
  printf("    dDualTol:          %.4e\n",pCVar1->dDualTol);
  printf("    dGapTol:           %.4e\n",pCVar1->dGapTol);
  printf("    dFeasTol:          %.4e\n",pCVar2->dFeasTol);
  printf("    eRestartMethod:    %d\n",(ulong)pCVar1->eRestartMethod);
  printf("    nLogLevel:    %d\n",(ulong)(uint)pCVar1->nLogLevel);
  printf("    nLogInterval:    %d\n",(ulong)(uint)pCVar1->nLogInterval);
  printf("    iInfNormAbsLocalTermination:    %d\n",(ulong)(uint)pCVar1->iInfNormAbsLocalTermination
        );
  putchar(10);
  puts("--------------------------------------------------");
  putchar(10);
  return;
}

Assistant:

void PDHG_PrintPDHGParam(CUPDLPwork *w) {
  if (w->settings->nLogLevel < 2) return;
  CUPDLPsettings *settings = w->settings;
  CUPDLPstepsize *stepsize = w->stepsize;
  CUPDLPresobj *resobj = w->resobj;
  CUPDLPiterates *iterates = w->iterates;
  CUPDLPscaling *scaling = w->scaling;
  CUPDLPtimers *timers = w->timers;

  cupdlp_printf("\n");

  cupdlp_printf("\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("CUPDHG Parameters:\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("\n");

  cupdlp_printf("    nIterLim:          %d\n", settings->nIterLim);
  cupdlp_printf("    dTimeLim (sec):    %.2f\n", settings->dTimeLim);
  cupdlp_printf("    ifScaling:         %d\n", settings->ifScaling);
  // cupdlp_printf("    iScalingMethod:    %d\n", settings->iScalingMethod);)
  cupdlp_printf("    ifRuizScaling:     %d\n", scaling->ifRuizScaling);
  cupdlp_printf("    ifL2Scaling:       %d\n", scaling->ifL2Scaling);
  cupdlp_printf("    ifPcScaling:       %d\n", scaling->ifPcScaling);
  cupdlp_printf("    eLineSearchMethod: %d\n", stepsize->eLineSearchMethod);
  // cupdlp_printf("    dScalingLimit:     %.4e\n", settings->dScalingLimit);
  cupdlp_printf("    dPrimalTol:        %.4e\n", settings->dPrimalTol);
  cupdlp_printf("    dDualTol:          %.4e\n", settings->dDualTol);
  cupdlp_printf("    dGapTol:           %.4e\n", settings->dGapTol);
  cupdlp_printf("    dFeasTol:          %.4e\n", resobj->dFeasTol);
  cupdlp_printf("    eRestartMethod:    %d\n", settings->eRestartMethod);
  cupdlp_printf("    nLogLevel:    %d\n", settings->nLogLevel);
  cupdlp_printf("    nLogInterval:    %d\n", settings->nLogInterval);
  cupdlp_printf("    iInfNormAbsLocalTermination:    %d\n", settings->iInfNormAbsLocalTermination);
  cupdlp_printf("\n");
  cupdlp_printf("--------------------------------------------------\n");
  cupdlp_printf("\n");
}